

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogTestListener.cpp
# Opt level: O0

void __thiscall
rc::detail::LogTestListener::onTestCaseFinished(LogTestListener *this,CaseDescription *description)

{
  Type TVar1;
  ostream *poVar2;
  char *pcVar3;
  CaseDescription *description_local;
  LogTestListener *this_local;
  
  if ((this->m_verboseProgress & 1U) != 0) {
    TVar1 = (description->result).type;
    if (TVar1 == Success) {
      std::operator<<(this->m_out,".");
    }
    else if (TVar1 == Failure) {
      poVar2 = (ostream *)
               std::ostream::operator<<(this->m_out,std::endl<char,std::char_traits<char>>);
      std::operator<<(poVar2,"Found failure, shrinking");
      pcVar3 = "...";
      if ((this->m_verboseShrinking & 1U) != 0) {
        pcVar3 = ":";
      }
      poVar2 = std::operator<<(this->m_out,pcVar3);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    else if (TVar1 == Discard) {
      std::operator<<(this->m_out,"x");
    }
  }
  return;
}

Assistant:

void LogTestListener::onTestCaseFinished(const CaseDescription &description) {
  if (!m_verboseProgress) {
    return;
  }

  switch (description.result.type) {
  case CaseResult::Type::Success:
    m_out << ".";
    break;
  case CaseResult::Type::Discard:
    m_out << "x";
    break;
  case CaseResult::Type::Failure:
    m_out << std::endl << "Found failure, shrinking";
    m_out << (m_verboseShrinking ? ":" : "...") << std::endl;
    break;
  }
}